

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
CP::priority_queue<int,_std::less<int>_>::at_level
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          priority_queue<int,_std::less<int>_> *this,size_t k)

{
  ulong uVar1;
  ostream *poVar2;
  size_t i;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  size_type __n;
  ulong uVar6;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __n = (size_type)(1 << ((byte)k & 0x1f));
  std::vector<int,_std::allocator<int>_>::reserve(__return_storage_ptr__,__n);
  uVar5 = 0;
  for (sVar3 = 0; k != sVar3; sVar3 = sVar3 + 1) {
    uVar5 = uVar5 + (long)(1 << ((byte)sVar3 & 0x1f));
  }
  uVar6 = __n + uVar5;
  lVar4 = uVar5 * 8;
  while( true ) {
    uVar1 = this->mSize;
    if (uVar6 <= this->mSize) {
      uVar1 = uVar6;
    }
    if (uVar1 <= uVar5) break;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::vector<int,std::allocator<int>>::emplace_back<int&>
              ((vector<int,std::allocator<int>> *)__return_storage_ptr__,
               (int *)((long)this->mData + lVar4));
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 4;
  }
  std::
  sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::less<int>>
            ();
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> CP::priority_queue<T,Comp>::at_level(size_t k) const {
    std::vector<T> r;
    r.reserve(1 << k);
    size_t ind = 0;
    for (size_t i = 0; i < k; ++i) {
        ind += 1 << i;
    }
    for (size_t i = ind; i < std::min(ind + (1 << k), mSize); ++i) {
        std::cout << i << std::endl;
        r.emplace_back(mData[ind+i]);
    }
    std::sort(r.rbegin(), r.rend(), mLess);
    return r;
}